

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseInsensitive.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::CaseInsensitive::Transform::Apply<unsigned_int>(Transform *this,uint c,uint *outEquiv)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  
  if ((c < this->lo) || (this->hi < c)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CaseInsensitive.cpp"
                       ,0x29,"(c >= lo && c <= hi)","c >= lo && c <= hi");
    if (!bVar2) goto LAB_00e6be17;
    *puVar3 = 0;
  }
  iVar5 = 0;
  if ((this->lo + 1) % (uint)this->skipCountOfRange == c % (uint)this->skipCountOfRange) {
    iVar5 = this->delta0;
  }
  if (0x10ffff < iVar5 + c) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0xbd,"(u <= MaxUChar)","u <= MaxUChar");
    if (!bVar2) goto LAB_00e6be17;
    *puVar3 = 0;
  }
  *outEquiv = iVar5 + c;
  if (this->lo % (uint)this->skipCountOfRange == c % (uint)this->skipCountOfRange) {
    uVar6 = this->delta1 + c;
    if (0x10ffff < uVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0xc3,"(i >= 0 && i <= MaxUChar)","i >= 0 && i <= MaxUChar");
      if (!bVar2) goto LAB_00e6be17;
      *puVar3 = 0;
    }
    outEquiv[1] = uVar6;
    uVar6 = this->delta2 + c;
    if (0x10ffff < uVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0xc3,"(i >= 0 && i <= MaxUChar)","i >= 0 && i <= MaxUChar");
      if (!bVar2) goto LAB_00e6be17;
      *puVar3 = 0;
    }
    outEquiv[2] = uVar6;
    c = c + this->delta3;
    lVar4 = 0xc;
    if (0x10ffff < c) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0xc3,"(i >= 0 && i <= MaxUChar)","i >= 0 && i <= MaxUChar");
      if (!bVar2) {
LAB_00e6be17:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  else {
    if (0x10ffff < c) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0xbd,"(u <= MaxUChar)","u <= MaxUChar");
      if (!bVar2) goto LAB_00e6be17;
      *puVar3 = 0;
    }
    outEquiv[3] = c;
    outEquiv[2] = c;
    lVar4 = 4;
  }
  *(uint *)((long)outEquiv + lVar4) = c;
  return;
}

Assistant:

inline void Apply(uint c, Char outEquiv[EquivClassSize]) const
            {
                Assert(c >= lo && c <= hi);

                outEquiv[0] = Chars<Char>::UTC((lo + 1) % skipCountOfRange == c % skipCountOfRange ? (int)c + delta0 : c);

                CompileAssert(CaseInsensitive::EquivClassSize == 4);
                if (lo  % skipCountOfRange == c % skipCountOfRange)
                {
                    outEquiv[1] = Chars<Char>::ITC((int)c + delta1);
                    outEquiv[2] = Chars<Char>::ITC((int)c + delta2);
                    outEquiv[3] = Chars<Char>::ITC((int)c + delta3);
                }
                else
                {
                    outEquiv[1] = outEquiv[2] = outEquiv[3] = Chars<Char>::UTC(c);
                }
            }